

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O1

void render_state_end(render_state_t *state)

{
  float *pfVar1;
  render_state *prVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  plutovg_rect_t extents;
  plutovg_matrix_t matrix;
  plutovg_rect_t local_40;
  plutovg_matrix_t local_30;
  
  if (((state->mode != render_mode_painting) &&
      (pfVar1 = &(state->extents).w, 0.0 < *pfVar1 || *pfVar1 == 0.0)) &&
     (pfVar1 = &(state->extents).h, 0.0 < *pfVar1 || *pfVar1 == 0.0)) {
    plutovg_matrix_invert(&state->parent->matrix,&local_30);
    plutovg_matrix_multiply(&local_30,&state->matrix,&local_30);
    plutovg_matrix_map_rect(&local_30,&state->extents,&local_40);
    prVar2 = state->parent;
    fVar3 = (prVar2->extents).w;
    if ((fVar3 < 0.0) || (fVar4 = (prVar2->extents).h, fVar4 < 0.0)) {
      (prVar2->extents).x = local_40.x;
      (prVar2->extents).y = local_40.y;
      (prVar2->extents).w = local_40.w;
      (prVar2->extents).h = local_40.h;
    }
    else {
      fVar5 = (prVar2->extents).x;
      fVar6 = (prVar2->extents).y;
      fVar3 = fVar3 + fVar5;
      if (local_40.x <= fVar5) {
        fVar5 = local_40.x;
      }
      fVar4 = fVar4 + fVar6;
      if (local_40.y <= fVar6) {
        fVar6 = local_40.y;
      }
      if (fVar3 <= local_40.x + local_40.w) {
        fVar3 = local_40.x + local_40.w;
      }
      if (fVar4 <= local_40.y + local_40.h) {
        fVar4 = local_40.y + local_40.h;
      }
      (prVar2->extents).x = fVar5;
      (prVar2->extents).y = fVar6;
      (prVar2->extents).w = fVar3 - fVar5;
      (prVar2->extents).h = fVar4 - fVar6;
    }
  }
  return;
}

Assistant:

static void render_state_end(render_state_t* state)
{
    if(state->mode == render_mode_painting)
        return;
    if(IS_INVALID_RECT(state->extents)) {
        return;
    }

    plutovg_matrix_t matrix;
    plutovg_matrix_invert(&state->parent->matrix, &matrix);
    plutovg_matrix_multiply(&matrix, &state->matrix, &matrix);

    plutovg_rect_t extents;
    plutovg_matrix_map_rect(&matrix, &state->extents, &extents);
    if(IS_INVALID_RECT(state->parent->extents)) {
        state->parent->extents = extents;
        return;
    }

    float l = MIN(state->parent->extents.x, extents.x);
    float t = MIN(state->parent->extents.y, extents.y);
    float r = MAX(state->parent->extents.x + state->parent->extents.w, extents.x + extents.w);
    float b = MAX(state->parent->extents.y + state->parent->extents.h, extents.y + extents.h);

    state->parent->extents.x = l;
    state->parent->extents.y = t;
    state->parent->extents.w = r - l;
    state->parent->extents.h = b - t;
}